

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O0

void send_loc_info(char *file,int line)

{
  FILE *fdes;
  undefined1 local_28 [8];
  LocMsg lmsg;
  int line_local;
  char *file_local;
  
  lmsg.file._4_4_ = line;
  lmsg._0_8_ = strdup(file);
  local_28._0_4_ = lmsg.file._4_4_;
  fdes = get_pipe();
  ppack(fdes,CK_MSG_LOC,(CheckMsg *)local_28);
  free((void *)lmsg._0_8_);
  return;
}

Assistant:

void send_loc_info(const char *file, int line)
{
    LocMsg lmsg;

    lmsg.file = strdup(file);
    lmsg.line = line;
    ppack(get_pipe(), CK_MSG_LOC, (CheckMsg *) & lmsg);
    free(lmsg.file);
}